

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O2

long mk_supp(long index,supplier_t *s)

{
  set_member *psVar1;
  long lVar2;
  int iVar3;
  long seed;
  long i;
  
  s->suppkey = index;
  sprintf(s->name,"%s%09ld","Supplier#",index);
  iVar3 = a_rnd(6,0x18,0x20,s->address);
  s->alen = iVar3;
  dss_random(&i,0,(long)nations.count + -1,0x21);
  lVar2 = i;
  psVar1 = nations.list;
  strcpy(s->nation_name,nations.list[i].text);
  strcpy(s->region_name,regions.list[psVar1[lVar2].weight].text);
  gen_city(s->city,s->nation_name);
  gen_phone(i,s->phone,seed);
  return 0;
}

Assistant:

long
mk_supp(long index, supplier_t *s)
{
	long i;
	/* long bad_press; */
	/* long noise; */
	/* long offset; */
	/* long type; */
        s->suppkey = index;
	sprintf(s->name, S_NAME_FMT, S_NAME_TAG, index); 
	s->alen = V_STR(S_ADDR_LEN, S_ADDR_SD, s->address);
	RANDOM(i, 0, nations.count-1, S_NTRG_SD);
	strcpy(s->nation_name,nations.list[i].text);
        strcpy(s->region_name,regions.list[nations.list[i].weight].text);
	gen_city(s->city,s->nation_name);
	gen_phone(i, s->phone, (long)C_PHNE_SD);
	return (0);
}